

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

string * __thiscall
luna::GetTokenStr_abi_cxx11_(string *__return_storage_ptr__,luna *this,TokenDetail *t)

{
  int iVar1;
  char *__s;
  ostringstream oss;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  string local_190 [3];
  ios_base local_120 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = *(int *)(this + 0x18);
  if (iVar1 == 0x117) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::ostream::_M_insert<double>(*(double *)this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b0);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
  else if (iVar1 - 0x115U < 2) {
    String::GetStdString_abi_cxx11_(local_190,*(String **)this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190[0]._M_dataplus._M_p != &local_190[0].field_2) {
      operator_delete(local_190[0]._M_dataplus._M_p);
    }
  }
  else if (iVar1 - 0x100U < 0x1f) {
    __s = *(char **)(token_str + (ulong)(iVar1 - 0x100U) * 8);
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)__s);
  }
  else {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTokenStr(const TokenDetail &t)
    {
        std::string str;

        int token = t.token_;
        if (token == Token_Number)
        {
            std::ostringstream oss;
            oss << t.number_;
            str = oss.str();
        }
        else if (token == Token_Id || token == Token_String)
        {
            str = t.str_->GetStdString();
        }
        else if (token >= Token_And && token <= Token_EOF)
        {
            str = token_str[token - Token_And];
        }
        else
        {
            str.push_back(token);
        }

        return str;
    }